

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDef.cpp
# Opt level: O1

bool operator<(AmsNetId *lhs,AmsNetId *rhs)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  
  bVar5 = lhs->b[0];
  bVar3 = rhs->b[0];
  bVar4 = true;
  if (bVar5 == bVar3) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      bVar4 = uVar2 < 5;
      if (uVar2 == 5) goto LAB_001177d1;
      bVar5 = lhs->b[uVar2 + 1];
      bVar3 = rhs->b[uVar2 + 1];
      uVar1 = uVar2 + 1;
    } while (bVar5 == bVar3);
    bVar4 = uVar2 < 5;
  }
  bVar5 = bVar5 < bVar3;
LAB_001177d1:
  return (bool)(bVar4 & bVar5);
}

Assistant:

bool operator<(const AmsNetId& lhs, const AmsNetId& rhs)
{
    for (unsigned int i = 0; i < sizeof(rhs.b); ++i) {
        if (lhs.b[i] != rhs.b[i]) {
            return lhs.b[i] < rhs.b[i];
        }
    }
    return false;
}